

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluCallLogWrapper.cpp
# Opt level: O2

ostream * __thiscall glu::operator<<(glu *this,ostream *str,FboParamPtrFmt fmt)

{
  int iVar1;
  ostream *poVar2;
  uint *puVar3;
  Hex<8UL> hex;
  Enum<int,_2UL> local_10;
  
  puVar3 = fmt._0_8_;
  if (puVar3 == (uint *)0x0) {
    poVar2 = std::operator<<((ostream *)this,"(null)");
    return poVar2;
  }
  iVar1 = (int)str;
  if (iVar1 - 0x8212U < 6) {
switchD_008b6281_caseD_8cd1:
    poVar2 = (ostream *)std::ostream::operator<<(this,*puVar3);
    return poVar2;
  }
  switch(iVar1) {
  case 0x8cd0:
    local_10.m_value = *puVar3;
    local_10.m_getName = getFramebufferAttachmentTypeName;
    break;
  case 0x8cd1:
  case 0x8cd2:
  case 0x8cd4:
    goto switchD_008b6281_caseD_8cd1;
  case 0x8cd3:
    local_10.m_value = *puVar3;
    local_10.m_getName = getCubeMapFaceName;
    break;
  default:
    if (iVar1 == 0x8210) {
      local_10.m_value = *puVar3;
      local_10.m_getName = getFramebufferColorEncodingName;
    }
    else if (iVar1 == 0x8211) {
      local_10.m_value = *puVar3;
      local_10.m_getName = getTypeName;
    }
    else {
      if (iVar1 != 0x8da7) {
        hex.value._4_4_ = 0;
        hex.value._0_4_ = *puVar3;
        poVar2 = tcu::Format::operator<<((ostream *)this,hex);
        return poVar2;
      }
      local_10.m_value = *puVar3;
      local_10.m_getName = getBooleanName;
    }
  }
  poVar2 = tcu::Format::Enum<int,_2UL>::toStream(&local_10,(ostream *)this);
  return poVar2;
}

Assistant:

std::ostream& operator<< (std::ostream& str, FboParamPtrFmt fmt)
{
	if (fmt.value)
	{
		switch (fmt.param)
		{
			case GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE:
				return str << tcu::Format::Enum<int, 2>(getFramebufferAttachmentTypeName, *fmt.value);

			case GL_FRAMEBUFFER_ATTACHMENT_TEXTURE_CUBE_MAP_FACE:
				return str << tcu::Format::Enum<int, 2>(getCubeMapFaceName, *fmt.value);

			case GL_FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE:
				return str << tcu::Format::Enum<int, 2>(getTypeName, *fmt.value);

			case GL_FRAMEBUFFER_ATTACHMENT_COLOR_ENCODING:
				return str << tcu::Format::Enum<int, 2>(getFramebufferColorEncodingName, *fmt.value);

			case GL_FRAMEBUFFER_ATTACHMENT_LAYERED:
				return str << tcu::Format::Enum<int, 2>(getBooleanName, *fmt.value);

			case GL_FRAMEBUFFER_ATTACHMENT_OBJECT_NAME:
			case GL_FRAMEBUFFER_ATTACHMENT_TEXTURE_LAYER:
			case GL_FRAMEBUFFER_ATTACHMENT_TEXTURE_LEVEL:
			case GL_FRAMEBUFFER_ATTACHMENT_RED_SIZE:
			case GL_FRAMEBUFFER_ATTACHMENT_GREEN_SIZE:
			case GL_FRAMEBUFFER_ATTACHMENT_BLUE_SIZE:
			case GL_FRAMEBUFFER_ATTACHMENT_ALPHA_SIZE:
			case GL_FRAMEBUFFER_ATTACHMENT_DEPTH_SIZE:
			case GL_FRAMEBUFFER_ATTACHMENT_STENCIL_SIZE:
				return str << *fmt.value;

			default:
				return str << tcu::toHex(*fmt.value);
		}
	}
	else
		return str << "(null)";
}